

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O1

int __thiscall xercesc_4_0::VecAttributesImpl::getIndex(VecAttributesImpl *this,XMLCh *qName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ulong uVar3;
  XMLAttr *this_00;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  int iVar6;
  ulong unaff_RBP;
  XMLSize_t getAt;
  bool bVar7;
  
  iVar6 = -1;
  if (this->fCount != 0) {
    getAt = 0;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                          (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      pXVar4 = XMLAttr::getQName(this_00);
      bVar7 = true;
      if (pXVar4 != qName) {
        pXVar5 = qName;
        if (pXVar4 == (XMLCh *)0x0 || qName == (XMLCh *)0x0) {
          if (pXVar4 == (XMLCh *)0x0) {
            if (qName != (XMLCh *)0x0) goto LAB_002bf406;
          }
          else {
            bVar7 = *pXVar4 == L'\0';
            if ((qName != (XMLCh *)0x0) && (*pXVar4 == L'\0')) {
LAB_002bf406:
              bVar7 = *pXVar5 == L'\0';
            }
          }
        }
        else {
          do {
            XVar1 = *pXVar4;
            if (XVar1 == L'\0') goto LAB_002bf406;
            pXVar4 = pXVar4 + 1;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
          } while (XVar1 == XVar2);
          bVar7 = false;
        }
      }
      uVar3 = unaff_RBP;
      if (bVar7) {
        uVar3 = getAt;
      }
      unaff_RBP = uVar3 & 0xffffffff;
      iVar6 = (int)uVar3;
    } while ((!bVar7) && (getAt = getAt + 1, iVar6 = -1, getAt < this->fCount));
  }
  return iVar6;
}

Assistant:

int VecAttributesImpl::getIndex(const XMLCh* const qName ) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), qName))
            return (int)index ;
    }
    return -1;
}